

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  string *content;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  int iVar4;
  cmCTest *pcVar5;
  char cVar6;
  bool bVar7;
  cmValue dir;
  ostream *poVar8;
  size_t sVar9;
  cmCTestP4 *this_00;
  long lVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  ulong *puVar14;
  char *__s;
  int iVar15;
  undefined8 uVar16;
  int iVar17;
  string end_time;
  string changeId;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg_3;
  time_point start_time_time;
  string buildname;
  string start_time;
  cmCLocaleEnvironmentScope fixLocale;
  cmGeneratedFileStream os;
  cmGeneratedFileStream ofs;
  cmCTestP4 *local_7e8;
  char local_7da;
  char local_7d9;
  string local_7d8;
  string local_7b8;
  string local_798;
  undefined1 local_778 [88];
  undefined1 local_720 [112];
  ios_base local_6b0 [264];
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_588;
  long local_580;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_578;
  string local_570;
  string local_550;
  cmCLocaleEnvironmentScope local_530;
  undefined1 local_500 [16];
  _func_int *local_4f0 [12];
  ios_base local_490 [504];
  undefined1 local_298 [112];
  ios_base local_228 [504];
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(&local_530);
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"SourceDirectory","");
  dir = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (dir.Value == (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"Cannot find SourceDirectory  key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
    std::ostream::put((char)local_298);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x74,(char *)local_500._0_8_,false);
    if ((_func_int **)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_,(ulong)(local_4f0[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
    iVar17 = -1;
    goto LAB_00223e5e;
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
  bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
  if (!bVar7) {
    cmCTestGenericHandler::StartLogFile
              (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_298);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_500,"   Updating the repository: ",0x1c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_500,((dir.Value)->_M_dataplus)._M_p,
                      (dir.Value)->_M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x80,(char *)local_720._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  pcVar3 = local_720 + 0x10;
  if ((char *)local_720._0_8_ != pcVar3) {
    operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
  std::ios_base::~ios_base(local_490);
  bVar7 = SelectVCS(this);
  iVar17 = -1;
  if (bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,"   Use ",7);
    if ((ulong)(uint)this->UpdateType < 7) {
      __s = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
    }
    else {
      __s = "Unknown";
    }
    if (__s == (char *)0x0) {
      std::ios::clear((int)(_func_int *)
                           ((long)&local_7e8 + (long)*(_func_int **)(local_500._0_8_ + -0x18)) +
                      0x2e8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,__s,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500," repository type",0x10)
    ;
    std::ios::widen((char)*(_func_int **)(local_500._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x8a,(char *)local_720._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((char *)local_720._0_8_ != pcVar3) {
      operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    switch(this->UpdateType) {
    case 1:
      this_00 = (cmCTestP4 *)operator_new(0x1b8);
      cmCTestCVS::cmCTestCVS
                ((cmCTestCVS *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_298);
      break;
    case 2:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestSVN::cmCTestSVN
                ((cmCTestSVN *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_298);
      break;
    case 3:
      this_00 = (cmCTestP4 *)operator_new(0x330);
      cmCTestBZR::cmCTestBZR
                ((cmCTestBZR *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_298);
      break;
    case 4:
      this_00 = (cmCTestP4 *)operator_new(0x318);
      cmCTestGIT::cmCTestGIT
                ((cmCTestGIT *)this_00,(this->super_cmCTestGenericHandler).CTest,
                 (ostream *)local_298);
      break;
    case 5:
      this_00 = (cmCTestP4 *)operator_new(0x310);
      cmCTestHG::cmCTestHG
                ((cmCTestHG *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_298
                );
      break;
    case 6:
      this_00 = (cmCTestP4 *)operator_new(0x370);
      cmCTestP4::cmCTestP4(this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_298);
      break;
    default:
      this_00 = (cmCTestP4 *)operator_new(0x188);
      cmCTestVC::cmCTestVC
                ((cmCTestVC *)this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_298
                );
    }
    cmCTestVC::SetCommandLineTool((cmCTestVC *)this_00,&this->UpdateCommand);
    cmCTestVC::SetSourceDirectory((cmCTestVC *)this_00,dir.Value);
    cmCTestVC::Cleanup((cmCTestVC *)this_00);
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_500,None);
    bVar7 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                       (cmGeneratedFileStream *)local_500);
    if (bVar7) {
      local_7e8 = this_00;
      cmCTest::CurrentTime_abi_cxx11_(&local_550,(this->super_cmCTestGenericHandler).CTest);
      local_578.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      lVar10 = std::chrono::_V2::steady_clock::now();
      local_7d9 = cmCTestVC::Update((cmCTestVC *)this_00);
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      local_778._0_8_ = local_778 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"BuildName","");
      cmCTest::GetCTestConfiguration((string *)local_720,pcVar5,(string *)local_778);
      cmCTest::SafeBuildIdField(&local_570,(string *)local_720);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
        operator_delete((void *)local_778._0_8_,local_778._16_8_ + 1);
      }
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_778,(ostream *)local_500,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_778,"UTF-8");
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"Update","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_778,"mode",(char (*) [7])0x89c521);
      paVar1 = &local_7b8.field_2;
      local_7b8._M_dataplus._M_p = (pointer)paVar1;
      local_580 = lVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"ctest-","");
      cmVersion::GetCMakeVersion();
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_7b8);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar13) {
        local_720._16_8_ = *psVar13;
        local_720._24_8_ = plVar11[3];
        local_720._0_8_ = pcVar3;
      }
      else {
        local_720._16_8_ = *psVar13;
        local_720._0_8_ = (size_type *)*plVar11;
      }
      local_720._8_8_ = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_778,"Generator",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"Site","");
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      paVar2 = &local_7d8.field_2;
      local_7d8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"Site","");
      cmCTest::GetCTestConfiguration(&local_7b8,pcVar5,&local_7d8);
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_7b8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"BuildName","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_570);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"BuildStamp","");
      cmCTest::GetCurrentTag_abi_cxx11_(&local_798,(this->super_cmCTestGenericHandler).CTest);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_798);
      puVar14 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_7d8.field_2._M_allocated_capacity = *puVar14;
        local_7d8.field_2._8_8_ = plVar11[3];
        local_7d8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_7d8.field_2._M_allocated_capacity = *puVar14;
        local_7d8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_7d8._M_string_length = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmCTest::GetTestModelString_abi_cxx11_(&local_5a8,(this->super_cmCTestGenericHandler).CTest);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar2) {
        uVar16 = local_7d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_5a8._M_string_length + local_7d8._M_string_length) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          uVar16 = local_5a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_5a8._M_string_length + local_7d8._M_string_length)
        goto LAB_00223315;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_5a8,0,(char *)0x0,(ulong)local_7d8._M_dataplus._M_p);
      }
      else {
LAB_00223315:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_7d8,(ulong)local_5a8._M_dataplus._M_p);
      }
      psVar13 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_7b8.field_2._M_allocated_capacity = *psVar13;
        local_7b8.field_2._8_8_ = puVar12[3];
        local_7b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_7b8.field_2._M_allocated_capacity = *psVar13;
        local_7b8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_7b8._M_string_length = puVar12[1];
      *puVar12 = psVar13;
      puVar12[1] = 0;
      *(undefined1 *)psVar13 = 0;
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_7b8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_798._M_dataplus._M_p != &local_798.field_2) {
        operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"StartDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_550);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"StartTime","");
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((cmXMLWriter *)local_778,(string *)local_720,&local_578);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"UpdateCommand","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      content = &(this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine;
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,content);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"UpdateType","");
      if ((ulong)(uint)this->UpdateType < 7) {
        local_7b8._M_dataplus._M_p = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
      }
      else {
        local_7b8._M_dataplus._M_p = "Unknown";
      }
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<char_const*>((cmXMLWriter *)local_778,(char **)&local_7b8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"ChangeId","");
      cmCTest::GetCTestConfiguration(&local_7b8,pcVar5,(string *)local_720);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      if (local_7b8._M_string_length != 0) {
        local_720._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"ChangeId","");
        cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
        cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_7b8);
        cmXMLWriter::EndElement((cmXMLWriter *)local_778);
        if ((char *)local_720._0_8_ != pcVar3) {
          operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
        }
      }
      local_588 = content;
      local_7da = cmCTestVC::WriteXML((cmCTestVC *)this_00,(cmXMLWriter *)local_778);
      iVar17 = (this_00->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[0];
      if (iVar17 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"   Found ",9);
        poVar8 = (ostream *)std::ostream::operator<<(local_720,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," updated files\n",0xf);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xd8,local_7d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
      }
      iVar15 = (local_7e8->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[1];
      if (iVar15 == 0) {
        iVar15 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"   Found ",9);
        poVar8 = (ostream *)std::ostream::operator<<(local_720,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," locally modified files\n",0x18);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xdd,local_7d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
      }
      iVar4 = (local_7e8->super_cmCTestGlobalVC).super_cmCTestVC.PathCount[2];
      if (iVar4 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"   Found ",9);
        poVar8 = (ostream *)std::ostream::operator<<(local_720,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," conflicting files\n",0x13);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xe3,local_7d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        iVar15 = iVar15 + iVar4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"End",3);
      std::ios::widen((char)(ostream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18));
      std::ostream::put((char)local_720);
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xe7,local_7d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
      std::ios_base::~ios_base(local_6b0);
      cmCTest::CurrentTime_abi_cxx11_(&local_7d8,(this->super_cmCTestGenericHandler).CTest);
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"EndDateTime","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,&local_7d8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"EndTime","");
      local_798._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((cmXMLWriter *)local_778,(string *)local_720,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_798);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"ElapsedMinutes","");
      lVar10 = std::chrono::_V2::steady_clock::now();
      local_798._M_dataplus._M_p = (pointer)((lVar10 - local_580) / 60000000000);
      cmXMLWriter::Element<long>((cmXMLWriter *)local_778,(string *)local_720,(long *)&local_798);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      local_720._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"UpdateReturnStatus","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_778,(string *)local_720);
      if ((char *)local_720._0_8_ != pcVar3) {
        operator_delete((void *)local_720._0_8_,local_720._16_8_ + 1);
      }
      cVar6 = local_7d9;
      this_00 = local_7e8;
      if (iVar15 != 0) {
        cmXMLWriter::Content<char[72]>
                  ((cmXMLWriter *)local_778,
                   (char (*) [72])
                   "Update error: There are modified or conflicting files in the repository");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_720,
                   "   There are modified or conflicting files in the repository",0x3c);
        std::ios::widen((char)(ostream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_720);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xf6,local_798._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
      }
      if (cVar6 == '\0') {
        cmXMLWriter::Content<char[24]>
                  ((cmXMLWriter *)local_778,(char (*) [24])"Update command failed:\n");
        cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_778,local_588);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_720,"   Update command failed: ",0x1a);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_720,
                            (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                            _M_dataplus._M_p,
                            (this_00->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                            _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xfd,local_798._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_798._M_dataplus._M_p != &local_798.field_2) {
          operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      cmXMLWriter::EndElement((cmXMLWriter *)local_778);
      cmXMLWriter::EndDocument((cmXMLWriter *)local_778);
      if (local_7da == '\0') {
        iVar17 = -1;
      }
      if (cVar6 == '\0') {
        iVar17 = -1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_778);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_720,"Cannot open log file",0x14);
      std::ios::widen((char)(ostream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18));
      std::ostream::put((char)local_720);
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0xb1,(char *)local_778._0_8_,false);
      if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
        operator_delete((void *)local_778._0_8_,local_778._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
      std::ios_base::~ios_base(local_6b0);
      iVar17 = -1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
    (*(this_00->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[1])(this_00);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
LAB_00223e5e:
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope(&local_530);
  return iVar17;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  cmValue sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << *sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  std::unique_ptr<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc = cm::make_unique<cmCTestCVS>(this->CTest, ofs);
      break;
    case e_SVN:
      vc = cm::make_unique<cmCTestSVN>(this->CTest, ofs);
      break;
    case e_BZR:
      vc = cm::make_unique<cmCTestBZR>(this->CTest, ofs);
      break;
    case e_GIT:
      vc = cm::make_unique<cmCTestGIT>(this->CTest, ofs);
      break;
    case e_HG:
      vc = cm::make_unique<cmCTestHG>(this->CTest, ofs);
      break;
    case e_P4:
      vc = cm::make_unique<cmCTestP4>(this->CTest, ofs);
      break;
    default:
      vc = cm::make_unique<cmCTestVC>(this->CTest, ofs);
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(*sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file" << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  auto start_time_time = std::chrono::system_clock::now();
  auto elapsed_time_start = std::chrono::steady_clock::now();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp",
              this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));
  std::string changeId = this->CTest->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Element("ChangeId", changeId);
  }

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      "   Found " << numModified << " locally modified files\n", this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, WARNING,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Update command failed: " << vc->GetUpdateCommandLine()
                                            << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}